

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::applyBrand
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,Array<capnp::compiler::Compiler::CompiledType> *arguments)

{
  Compiler *compiler;
  Reader subSource;
  BrandedDecl *pBVar1;
  Array<capnp::compiler::BrandedDecl> *other;
  NullableValue<capnp::compiler::BrandedDecl> *other_00;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *other_01;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_448;
  CompiledType local_398;
  BrandedDecl *local_2e0;
  BrandedDecl *member;
  CapTableReader *pCStack_2d0;
  void *local_2c8;
  WirePointer *pWStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Array<capnp::compiler::BrandedDecl> local_2a0;
  Maybe<capnp::compiler::BrandedDecl> local_288;
  undefined1 local_1d8 [8];
  NullableValue<capnp::compiler::BrandedDecl> _member1422;
  Mapper<kj::Array<capnp::compiler::Compiler::CompiledType>_&> local_120;
  undefined1 local_118 [8];
  Array<capnp::compiler::BrandedDecl> args;
  undefined1 local_e8 [8];
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 local_d0 [6];
  bool found;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  Array<capnp::compiler::Compiler::CompiledType> *arguments_local;
  CompiledType *this_local;
  
  newDecl.value.source._reader._40_8_ = arguments;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
  lock.ptr._6_1_ = 0;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8,
             &this->compiler->impl);
  kj::_::Mapper<kj::Array<capnp::compiler::Compiler::CompiledType>_&>::Mapper(&local_120,arguments);
  _member1422.field_1._160_8_ = local_e8;
  kj::_::Mapper<kj::Array<capnp::compiler::Compiler::CompiledType>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:1421:17)>
            ((Array<capnp::compiler::BrandedDecl> *)local_118,&local_120,
             (anon_class_8_1_898e7229 *)&_member1422.field_1.value.source._reader.nestingLimit);
  pBVar1 = kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
           get<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>const>
                     (&this->decl,
                      (Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                      local_e8);
  other = kj::mv<kj::Array<capnp::compiler::BrandedDecl>>
                    ((Array<capnp::compiler::BrandedDecl> *)local_118);
  kj::Array<capnp::compiler::BrandedDecl>::Array(&local_2a0,other);
  local_2b8._0_4_ = 0;
  local_2b8._4_2_ = 0;
  local_2b8._6_2_ = 0;
  uStack_2b0._0_4_ = 0;
  uStack_2b0._4_4_ = 0;
  local_2c8 = (void *)0x0;
  pWStack_2c0 = (WirePointer *)0x0;
  member = (BrandedDecl *)0x0;
  pCStack_2d0 = (CapTableReader *)0x0;
  Expression::Reader::Reader((Reader *)&member);
  subSource._reader.capTable = pCStack_2d0;
  subSource._reader.segment = (SegmentReader *)member;
  subSource._reader.data = local_2c8;
  subSource._reader.pointers = pWStack_2c0;
  subSource._reader.dataSize = (StructDataBitCount)local_2b8;
  subSource._reader.pointerCount = local_2b8._4_2_;
  subSource._reader._38_2_ = local_2b8._6_2_;
  subSource._reader.nestingLimit = (int)uStack_2b0;
  subSource._reader._44_4_ = uStack_2b0._4_4_;
  BrandedDecl::applyParams(&local_288,pBVar1,&local_2a0,subSource);
  other_00 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_288);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d8,other_00);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_288);
  kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_2a0);
  pBVar1 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1d8);
  if (pBVar1 != (BrandedDecl *)0x0) {
    local_2e0 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                          ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d8);
    pBVar1 = kj::mv<capnp::compiler::BrandedDecl>(local_2e0);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
    set<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>const>
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0,
               (Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8,
               pBVar1);
    lock.ptr._6_1_ = 1;
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d8);
  kj::Array<capnp::compiler::BrandedDecl>::~Array((Array<capnp::compiler::BrandedDecl> *)local_118);
  kj::Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8);
  if ((lock.ptr._6_1_ & 1) == 0) {
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__);
  }
  else {
    compiler = this->compiler;
    other_01 = kj::mv<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>>
                         ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
              (&local_448,other_01);
    CompiledType(&local_398,compiler,&local_448);
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__,&local_398);
    ~CompiledType(&local_398);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_448);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::applyBrand(
    kj::Array<CompiledType> arguments) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    auto args = KJ_MAP(arg, arguments) { return kj::mv(arg.decl.get(lock)); };
    KJ_IF_SOME(member, decl.get(lock).applyParams(kj::mv(args), {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}